

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaQProp.cpp
# Opt level: O0

void __thiscall NaQuickProp::NaQuickProp(NaQuickProp *this,NaNNUnit *rNN)

{
  uint uVar1;
  uint uVar2;
  long *in_RDI;
  uint iLayer;
  NaNNUnit *in_stack_00000110;
  void **in_stack_00000118;
  NaStdBackProp *in_stack_00000120;
  uint in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  long *local_28;
  uint local_20;
  
  NaStdBackPropParams::NaStdBackPropParams
            ((NaStdBackPropParams *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  NaQuickPropParams::NaQuickPropParams
            ((NaQuickPropParams *)(in_RDI + 0x22),&PTR_construction_vtable_48__00196b88);
  NaStdBackProp::NaStdBackProp(in_stack_00000120,in_stack_00000118,in_stack_00000110);
  *in_RDI = (long)&PTR__NaQuickProp_001969c0;
  in_RDI[0x22] = (long)&PTR_MaxGrowthFactor_00196a20;
  in_RDI[0x24] = (long)&PTR_PrintLog_00196a60;
  in_RDI[0x28] = (long)&PTR__NaQuickProp_00196af8;
  local_28 = in_RDI + 1;
  do {
    NaVector::NaVector((NaVector *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
    local_28 = local_28 + 3;
  } while (local_28 != in_RDI + 0x22);
  local_20 = NaNeuralNetDescr::InputLayer
                       ((NaNeuralNetDescr *)((long)in_RDI + *(long *)(*in_RDI + -0x28) + 8));
  while( true ) {
    uVar1 = NaNeuralNetDescr::OutputLayer((NaNeuralNetDescr *)0x16096c);
    if (uVar1 < local_20) break;
    uVar1 = NaNeuralNetDescr::Inputs
                      ((NaNeuralNetDescr *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff74);
    (**(code **)(in_RDI[(ulong)local_20 * 3 + 1] + 0x20))(in_RDI + (ulong)local_20 * 3 + 1,uVar1);
    local_20 = local_20 + 1;
  }
  local_20 = NaNeuralNetDescr::InputLayer
                       ((NaNeuralNetDescr *)((long)in_RDI + *(long *)(*in_RDI + -0x28) + 8));
  while( true ) {
    uVar1 = local_20;
    uVar2 = NaNeuralNetDescr::OutputLayer((NaNeuralNetDescr *)0x160a90);
    if (uVar2 < uVar1) break;
    (**(code **)(in_RDI[(ulong)local_20 * 3 + 1] + 0x68))(in_RDI + (ulong)local_20 * 3 + 1);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

NaQuickProp::NaQuickProp (NaNNUnit& rNN)
: NaStdBackProp(rNN)
{
    unsigned    /*iInput, iNeuron, */iLayer;

    // Assign dimensions
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        Xinp_prev[iLayer].new_dim(nd.Inputs(iLayer));
    }

    // Initalize all values by zero
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        Xinp_prev[iLayer].init_zero();
    }
}